

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O0

Span<const_char> script::Expr(Span<const_char> *sp)

{
  long lVar1;
  Span<const_char> *pSVar2;
  undefined4 *in_RDI;
  long in_FS_OFFSET;
  Span<const_char> SVar3;
  Span<const_char> SVar4;
  char *it;
  int level;
  Span<const_char> ret;
  Span<const_char> *in_stack_ffffffffffffff88;
  undefined4 *count;
  Span<const_char> *in_stack_ffffffffffffff98;
  Span<const_char> *local_40;
  int local_34;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 0;
  for (local_40 = (Span<const_char> *)Span<const_char>::begin(in_stack_ffffffffffffff88);
      pSVar2 = (Span<const_char> *)Span<const_char>::end(in_stack_ffffffffffffff88),
      local_40 != pSVar2; local_40 = (Span<const_char> *)((long)&local_40->m_data + 1)) {
    if ((*(char *)&local_40->m_data == '(') || (*(char *)&local_40->m_data == '{')) {
      local_34 = local_34 + 1;
    }
    else if ((local_34 == 0) ||
            ((*(char *)&local_40->m_data != ')' && (*(char *)&local_40->m_data != '}')))) {
      if ((local_34 == 0) &&
         (((*(char *)&local_40->m_data == ')' || (*(char *)&local_40->m_data == '}')) ||
          (*(char *)&local_40->m_data == ',')))) break;
    }
    else {
      local_34 = local_34 + -1;
    }
  }
  pSVar2 = local_40;
  count = in_RDI;
  Span<const_char>::begin(local_40);
  SVar3 = Span<const_char>::first(in_stack_ffffffffffffff98,(size_t)count);
  Span<const_char>::begin(pSVar2);
  SVar4 = Span<const_char>::subspan(local_40,(size_t)count);
  local_18 = SVar4.m_data._0_4_;
  uStack_14 = SVar4.m_data._4_4_;
  uStack_10 = (undefined4)SVar4.m_size;
  uStack_c = SVar4.m_size._4_4_;
  *in_RDI = local_18;
  in_RDI[1] = uStack_14;
  in_RDI[2] = uStack_10;
  in_RDI[3] = uStack_c;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return SVar3;
}

Assistant:

Span<const char> Expr(Span<const char>& sp)
{
    int level = 0;
    auto it = sp.begin();
    while (it != sp.end()) {
        if (*it == '(' || *it == '{') {
            ++level;
        } else if (level && (*it == ')' || *it == '}')) {
            --level;
        } else if (level == 0 && (*it == ')' || *it == '}' || *it == ',')) {
            break;
        }
        ++it;
    }
    Span<const char> ret = sp.first(it - sp.begin());
    sp = sp.subspan(it - sp.begin());
    return ret;
}